

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::operator/(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  logic_t lVar4;
  SVInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  bool bothSigned;
  bool bVar6;
  SVInt SVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aStack_58;
  uint uStack_50;
  undefined1 uStack_4c;
  byte bStack_4b;
  byte local_41;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  undefined8 uVar5;
  
  bothSigned = (bool)((in_RDX->super_SVIntStorage).signFlag & (rhs->super_SVIntStorage).signFlag);
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  uVar3 = (in_RDX->super_SVIntStorage).bitWidth;
  if (uVar2 == uVar3) {
    bVar1 = (rhs->super_SVIntStorage).unknownFlag;
    local_41 = (in_RDX->super_SVIntStorage).unknownFlag;
    bStack_4b = 0;
    aStack_58.val._0_6_ = 0;
    aStack_58.val._6_2_ = 0;
    uStack_4c = 1;
    uStack_50 = 1;
    clearUnusedBits((SVInt *)&aStack_58);
    lVar4 = operator==(in_RDX,(SVInt *)&aStack_58);
    bVar6 = true;
    if ((bVar1 == false) && ((local_41 & 1) == 0)) {
      bVar6 = (lVar4.value & 0x7f) != 0 && lVar4.value != '@';
    }
    if (((0x40 < uStack_50) || ((bStack_4b & 1) != 0)) &&
       ((void *)CONCAT26(aStack_58.val._6_2_,aStack_58.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(aStack_58.val._6_2_,aStack_58.val._0_6_));
    }
    if (bVar6) {
      SVar7 = createFillX(this,(rhs->super_SVIntStorage).bitWidth,bothSigned);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
      goto LAB_001f4b66;
    }
    if (bothSigned == false) {
LAB_001f4b0e:
      SVar7 = udiv(this,rhs,in_RDX,bothSigned);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
      goto LAB_001f4b66;
    }
    lVar4 = operator[](rhs,(rhs->super_SVIntStorage).bitWidth - 1);
    if (((lVar4.value == '\0') || (lVar4.value == '@')) || (lVar4.value == 0x80)) {
      lVar4 = operator[](in_RDX,(in_RDX->super_SVIntStorage).bitWidth - 1);
      if (((lVar4.value == '\0') || (lVar4.value == '@')) || (lVar4.value == 0x80))
      goto LAB_001f4b0e;
      operator-((SVInt *)&local_40);
      udiv((SVInt *)&aStack_58,rhs,(SVInt *)&local_40,true);
      SVar7 = operator-(this);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
    }
    else {
      lVar4 = operator[](in_RDX,(in_RDX->super_SVIntStorage).bitWidth - 1);
      if (((lVar4.value != '\0') && (lVar4.value != '@')) && (lVar4.value != 0x80)) {
        operator-((SVInt *)&aStack_58);
        operator-((SVInt *)&local_40);
        SVar7 = udiv(this,(SVInt *)&aStack_58,(SVInt *)&local_40,true);
        uVar5 = SVar7.super_SVIntStorage._8_8_;
        if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
          operator_delete__(local_40.pVal);
          uVar5 = extraout_RDX_01;
        }
        goto LAB_001f4b4a;
      }
      operator-((SVInt *)&local_40);
      udiv((SVInt *)&aStack_58,(SVInt *)&local_40,in_RDX,true);
      SVar7 = operator-(this);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
    }
    if (((0x40 < uStack_50) || ((bStack_4b & 1) != 0)) &&
       ((void *)CONCAT26(aStack_58.val._6_2_,aStack_58.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(aStack_58.val._6_2_,aStack_58.val._0_6_));
      uVar5 = extraout_RDX_00;
    }
    if ((local_38 < 0x41) && ((local_33 & 1) == 0)) goto LAB_001f4b66;
  }
  else {
    if (uVar2 < uVar3) {
      if (bothSigned == false) {
        zext((SVInt *)&aStack_58,(bitwidth_t)rhs);
      }
      else {
        sext((SVInt *)&aStack_58,(bitwidth_t)rhs);
      }
      SVar7 = operator/(this,(SVInt *)&aStack_58);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
    }
    else {
      if (bothSigned == false) {
        zext((SVInt *)&aStack_58,(bitwidth_t)in_RDX);
      }
      else {
        sext((SVInt *)&aStack_58,(bitwidth_t)in_RDX);
      }
      SVar7 = operator/(this,rhs);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
    }
LAB_001f4b4a:
    if ((uStack_50 < 0x41) && ((bStack_4b & 1) == 0)) goto LAB_001f4b66;
    local_40.val._6_2_ = aStack_58.val._6_2_;
    local_40.val._0_6_ = aStack_58.val._0_6_;
  }
  if ((void *)local_40.val != (void *)0x0) {
    operator_delete__(local_40.pVal);
    uVar5 = extraout_RDX;
  }
LAB_001f4b66:
  SVar7.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar7.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator/(const SVInt& rhs) const {
    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) / rhs;
        else
            return *this / rhs.extend(bitWidth, bothSigned);
    }

    // Any X's mean all X's; also dividing by zero does the same
    if (unknownFlag || rhs.unknownFlag || rhs == 0)
        return createFillX(bitWidth, bothSigned);

    // handle signed division
    if (bothSigned) {
        // do the division on positive numbers and flip the sign at the end
        if (isNegative()) {
            if (rhs.isNegative())
                return udiv(-(*this), -rhs, true);
            return -udiv(-(*this), rhs, true);
        }
        if (rhs.isNegative())
            return -udiv(*this, -rhs, true);
    }

    // otherwise, just do the division
    return udiv(*this, rhs, bothSigned);
}